

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

void check_integral_opt<int,zmq::sockopt::integral_option<25,int,false>>
               (socket_base *param_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2,
               char param_3)

{
  int iVar1;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef capturedExpression;
  int val;
  AssertionHandler catchAssertionHandler;
  undefined1 local_f8 [8];
  undefined8 local_f0;
  char *local_e8;
  undefined8 local_e0;
  undefined4 local_d8;
  ScopedMessage scopedMessage18;
  SourceLineInfo local_80;
  ScopedMessage scopedMessage17;
  
  val = 1;
  local_f8 = (undefined1  [8])0x18a9c9;
  local_f0 = 0xe5;
  macroName.m_size = 4;
  macroName.m_start = "INFO";
  Catch::MessageBuilder::MessageBuilder
            ((MessageBuilder *)&catchAssertionHandler,macroName,(SourceLineInfo *)local_f8,Info);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &scopedMessage18,"setting ",param_2);
  std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.macroName.m_size,
                  (string *)&scopedMessage18);
  Catch::ScopedMessage::ScopedMessage(&scopedMessage17,(MessageBuilder *)&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&scopedMessage18);
  Catch::MessageBuilder::~MessageBuilder((MessageBuilder *)&catchAssertionHandler);
  zmq::detail::socket_base::set<25,int,false>(param_1,&val);
  if (param_3 == '\0') {
    local_80.file =
         "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp";
    local_80.line = 0xea;
    macroName_00.m_size = 4;
    macroName_00.m_start = "INFO";
    Catch::MessageBuilder::MessageBuilder
              ((MessageBuilder *)&catchAssertionHandler,macroName_00,&local_80,Info);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   "getting ",param_2);
    std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.macroName.m_size,
                    (string *)local_f8);
    Catch::ScopedMessage::ScopedMessage(&scopedMessage18,(MessageBuilder *)&catchAssertionHandler);
    std::__cxx11::string::~string((string *)local_f8);
    Catch::MessageBuilder::~MessageBuilder((MessageBuilder *)&catchAssertionHandler);
    iVar1 = zmq::detail::socket_base::get<25,int,false>(param_1);
    local_f8 = (undefined1  [8])0x18a9c9;
    local_f0 = 0xec;
    macroName_01.m_size = 5;
    macroName_01.m_start = "CHECK";
    capturedExpression.m_size = 8;
    capturedExpression.m_start = "s == val";
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,macroName_01,(SourceLineInfo *)local_f8,capturedExpression,
               ContinueOnFailure);
    local_f0._0_2_ = CONCAT11(iVar1 == 1,true);
    local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d7490;
    local_f0 = CONCAT44(iVar1,(undefined4)local_f0);
    local_e8 = "==";
    local_e0 = 2;
    local_d8 = 1;
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_f8);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    Catch::ScopedMessage::~ScopedMessage(&scopedMessage18);
  }
  Catch::ScopedMessage::~ScopedMessage(&scopedMessage17);
  return;
}

Assistant:

void check_integral_opt(Opt opt,
                        zmq::socket_t &sock,
                        std::string info,
                        bool set_only = false)
{
    const T val = 1;
    INFO("setting " + info);
    sock.set(opt, val);
    if (set_only)
        return;

    INFO("getting " + info);
    auto s = sock.get(opt);
    CHECK(s == val);
}